

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

Vector3D * __thiscall
CMU462::Application::getMouseProjection
          (Vector3D *__return_storage_ptr__,Application *this,double dist)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  Vector4D ray_wor4;
  Matrix4x4 modelview_matrix;
  GLdouble modelview [16];
  GLdouble projection [16];
  Matrix4x4 projection_matrix;
  float local_360;
  float local_35c;
  float local_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined1 local_328 [16];
  double local_318;
  undefined1 local_308 [16];
  Vector4D local_2f8;
  Vector4D local_2d8;
  Matrix4x4 local_2b8;
  Matrix4x4 local_238;
  double local_1b8 [16];
  double local_138 [17];
  Matrix4x4 local_b0;
  
  local_318 = dist;
  glGetDoublev(0xba7,local_138);
  Matrix4x4::Matrix4x4(&local_b0,local_138);
  glGetDoublev(0xba6,local_1b8);
  Matrix4x4::Matrix4x4(&local_238,local_1b8);
  uVar2 = this->screenH;
  local_2d8.x = (double)((this->mouseX + this->mouseX) / (float)this->screenW + -1.0);
  dVar8 = (double)((float)uVar2 - this->mouseY);
  auVar9._8_4_ = (int)(uVar2 >> 0x20);
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = 0x45300000;
  local_2d8.y = (dVar8 + dVar8) /
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + -1.0;
  local_2d8.z = -1.0;
  local_2d8.w = 1.0;
  Matrix4x4::inv(&local_2b8,&local_b0);
  Matrix4x4::operator*(&local_2b8,&local_2d8);
  local_2f8.z = -1.0;
  local_2f8.w = 0.0;
  local_358 = (float)(this->camera).nClip;
  fStack_354 = (float)(this->camera).fClip;
  uStack_350 = 0;
  (*__glewBindFramebuffer)(0x8ca8,this->frntface_fbo);
  glReadPixels((int)this->mouseX,(int)((float)this->screenH - this->mouseY),1,1,0x1902,0x1406,
               &local_35c);
  auVar5._4_4_ = fStack_354;
  auVar5._0_4_ = local_358;
  auVar5._8_8_ = uStack_350;
  uStack_330 = (undefined4)uStack_350;
  uStack_32c = (undefined4)((ulong)uStack_350 >> 0x20);
  local_328._4_12_ = auVar5._4_12_;
  local_308._4_4_ = fStack_354;
  local_308._0_4_ = fStack_354;
  local_308._8_4_ = fStack_354;
  local_308._12_4_ = fStack_354;
  local_328._0_4_ = (local_358 + local_358) * fStack_354;
  local_348._4_12_ = local_308._4_12_;
  local_348._0_4_ = fStack_354 - local_358;
  local_338 = (double)CONCAT44(fStack_354,local_358 + fStack_354);
  local_35c = (float)local_328._0_4_ /
              ((local_358 + fStack_354) - (local_35c + local_35c + -1.0) * (float)local_348._0_4_);
  (*__glewBindFramebuffer)(0x8ca8,this->backface_fbo);
  glReadPixels((int)this->mouseX,(int)((float)this->screenH - this->mouseY),1,1,0x1902,0x1406,
               &local_360);
  local_360 = local_328._0_4_ /
              ((float)local_338 - (local_360 + local_360 + -1.0) * (float)local_348._0_4_);
  (*__glewBindFramebuffer)(0x8ca8,0);
  bVar6 = true;
  if (local_358 < local_35c) {
    bVar6 = ((float)local_308._0_4_ <= local_35c || (float)local_308._0_4_ <= local_360) ||
            local_360 <= local_358;
  }
  Matrix4x4::operator*(&local_238,&local_2f8);
  auVar1._0_8_ = (this->camera).pos.x;
  auVar1._8_8_ = (this->camera).pos.y;
  local_328._0_4_ = (undefined4)auVar1._0_8_;
  local_328._4_4_ = (undefined4)((ulong)auVar1._0_8_ >> 0x20);
  local_328._8_4_ = (undefined4)auVar1._8_8_;
  local_328._12_4_ = (undefined4)((ulong)auVar1._8_8_ >> 0x20);
  dVar8 = (this->camera).pos.z;
  if ((ulong)ABS(local_318) < 0x7ff0000000000000) {
    dVar7 = local_2b8.entries[0].z * local_2b8.entries[0].z +
            local_2b8.entries[0].x * local_2b8.entries[0].x +
            local_2b8.entries[0].y * local_2b8.entries[0].y;
    if (dVar7 < 0.0) {
      local_358 = SUB84(dVar8,0);
      fStack_354 = (float)((ulong)dVar8 >> 0x20);
      local_338 = local_2b8.entries[0].z;
      local_348._0_8_ = local_2b8.entries[0].x;
      local_348._8_8_ = local_2b8.entries[0].y;
      local_328 = auVar1;
      dVar7 = sqrt(dVar7);
      dVar8 = (double)CONCAT44(fStack_354,local_358);
      local_2b8.entries[0].z = local_338;
      local_2b8.entries[0].x = (double)local_348._0_8_;
      local_2b8.entries[0].y = (double)local_348._8_8_;
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = 1.0 / dVar7;
    local_2b8.entries[0].z = local_2b8.entries[0].z * dVar7;
    local_2b8.entries[0].x = local_2b8.entries[0].x * dVar7;
    local_2b8.entries[0].y = local_2b8.entries[0].y * dVar7;
  }
  else if (bVar6) {
    local_318 = (-local_2b8.entries[0].x * (double)auVar1._0_8_ -
                (double)auVar1._8_8_ * local_2b8.entries[0].y) - dVar8 * local_2b8.entries[0].z;
  }
  else {
    local_318 = (double)((local_360 - local_35c) * 0.5 + local_35c);
  }
  dVar7 = (double)CONCAT44(local_328._4_4_,local_328._0_4_) + local_318 * local_2b8.entries[0].x;
  dVar4 = (double)CONCAT44(local_328._12_4_,local_328._8_4_) + local_318 * local_2b8.entries[0].y;
  auVar3._8_4_ = SUB84(dVar4,0);
  auVar3._0_8_ = dVar7;
  auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
  __return_storage_ptr__->x = dVar7;
  __return_storage_ptr__->y = (double)auVar3._8_8_;
  __return_storage_ptr__->z = dVar8 + local_2b8.entries[0].z * local_318;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Application::getMouseProjection(double dist) {
  // get projection matrix from OpenGL stack.
  GLdouble projection[16];
  glGetDoublev(GL_PROJECTION_MATRIX, projection);
  Matrix4x4 projection_matrix(projection);

  // get view matrix from OpenGL stack.
  GLdouble modelview[16];
  glGetDoublev(GL_MODELVIEW_MATRIX, modelview);
  Matrix4x4 modelview_matrix(modelview);

  // ray in clip coordinates
  double x = mouseX * 2 / screenW - 1;
  double y = screenH - mouseY;  // y is upside down
  y = y * 2 / screenH - 1;

  Vector4D ray_clip(x, y, -1.0, 1.0);
  // ray in eye coordinates
  Vector4D ray_eye = projection_matrix.inv() * ray_clip;

  // ray is into the screen and not a point.
  ray_eye.z = -1.0;
  ray_eye.w = 0.0;

  GLfloat z1, z2;
  const float zNear = camera.near_clip();
  const float zFar = camera.far_clip();
  glBindFramebuffer(GL_READ_FRAMEBUFFER, frntface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z1);
  z1 = z1 * 2.f - 1.f;
  z1 = 2.f * zNear * zFar / (zFar + zNear - z1 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, backface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z2);
  z2 = z2 * 2.f - 1.f;
  z2 = 2.f * zNear * zFar / (zFar + zNear - z2 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);

  bool invalid = (z1 <= zNear || z2 <= zNear || z1 >= zFar || z2 >= zFar);

  // ray in world coordinates
  Vector4D ray_wor4 = modelview_matrix * ray_eye;
  Vector3D ray_wor(ray_wor4.x, ray_wor4.y, ray_wor4.z);

  Vector3D ray_orig(camera.position());

  double t = dot(ray_orig, -ray_wor);
  if(std::isfinite(dist)) {
    // If a distance was given, use that instead
    ray_wor = ray_wor.unit();
    t = dist;
  } else if(!invalid) {
    // The current ray  is not a unit vector - it is normalized in z
    // so we can simply move along that (scaled) ray by the viewspace
    // z value
    t = z1 + (z2 - z1) / 2.f; // average of in/out depth
  }

  Vector3D intersect = ray_orig + t * ray_wor;

  return intersect;
}